

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

char * __thiscall
google::protobuf::EnumValueDescriptorProto::_InternalParse
          (EnumValueDescriptorProto *this,char *ptr,ParseContext *ctx)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  EnumValueOptions *msg;
  char cVar4;
  uint32 res;
  uint tag;
  byte *ptr_00;
  uint uVar5;
  Arena *pAVar6;
  string *s;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  pair<const_char_*,_bool> pVar9;
  
  this_00 = &this->name_;
  uVar5 = 0;
LAB_0016d29f:
  do {
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((long)ptr - (long)(ctx->super_EpsCopyInputStream).buffer_end_ ==
          (long)(ctx->super_EpsCopyInputStream).limit_) goto LAB_0016d43a;
      pVar9 = internal::EpsCopyInputStream::DoneFallback
                        (&ctx->super_EpsCopyInputStream,ptr,ctx->group_depth_);
      ptr = pVar9.first;
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0016d43a;
    }
    bVar1 = *ptr;
    pVar7.second._0_1_ = bVar1;
    pVar7.first = (char *)((byte *)ptr + 1);
    pVar7._9_7_ = 0;
    if ((char)bVar1 < '\0') {
      bVar2 = ((byte *)ptr)[1];
      res = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
      if ((char)bVar2 < '\0') {
        pVar7 = internal::ReadTagFallback(ptr,res);
        if (pVar7.first == (char *)0x0) goto LAB_0016d450;
      }
      else {
        pVar7.second = res;
        pVar7.first = (char *)((byte *)ptr + 2);
        pVar7._12_4_ = 0;
      }
    }
    ptr_00 = (byte *)pVar7.first;
    tag = pVar7.second;
    uVar3 = (uint)(pVar7._8_8_ >> 3) & 0x1fffffff;
    cVar4 = (char)pVar7.second;
    if (uVar3 == 3) {
      if (cVar4 != '\x1a') goto LAB_0016d3b6;
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      msg = this->options_;
      if (msg == (EnumValueOptions *)0x0) {
        pAVar6 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
        }
        msg = Arena::CreateMaybeMessage<google::protobuf::EnumValueOptions>(pAVar6);
        this->options_ = msg;
      }
      ptr = internal::ParseContext::ParseMessage<google::protobuf::EnumValueOptions>
                      (ctx,msg,(char *)ptr_00);
    }
    else {
      if (uVar3 == 2) {
        if (cVar4 == '\x10') {
          bVar1 = *ptr_00;
          uVar5 = (uint)bVar1;
          ptr = (char *)(ptr_00 + 1);
          if ((char)bVar1 < '\0') {
            uVar5 = ((uint)bVar1 + (uint)(byte)*ptr * 0x80) - 0x80;
            if (*ptr < '\0') {
              pVar8 = internal::VarintParseSlow64((char *)ptr_00,uVar5);
              ptr = pVar8.first;
              this->number_ = (int32)pVar8.second;
              uVar5 = 4;
              goto LAB_0016d3d4;
            }
            ptr = (char *)(ptr_00 + 2);
          }
          this->number_ = uVar5;
          uVar5 = 4;
          goto LAB_0016d29f;
        }
      }
      else if ((uVar3 == 1) && (cVar4 == '\n')) {
        *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
        pAVar6 = (Arena *)(this->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                          .ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x18);
        }
        s = this_00->ptr_;
        if (s == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstance
                    (this_00,pAVar6,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
          s = this_00->ptr_;
        }
        ptr = internal::InlineGreedyStringParser(s,(char *)ptr_00,ctx);
        goto LAB_0016d3d4;
      }
LAB_0016d3b6:
      if ((tag == 0) || ((tag & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = tag - 1;
        ptr = (char *)ptr_00;
        goto LAB_0016d43a;
      }
      ptr = internal::UnknownFieldParse(tag,&this->_internal_metadata_,(char *)ptr_00,ctx);
    }
LAB_0016d3d4:
    if ((byte *)ptr == (byte *)0x0) {
LAB_0016d450:
      ptr = (char *)(byte *)0x0;
LAB_0016d43a:
      (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar5;
      return (char *)(byte *)ptr;
    }
  } while( true );
}

Assistant:

const char* EnumValueDescriptorProto::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParserUTF8Verify(_internal_mutable_name(), ptr, ctx, "google.protobuf.EnumValueDescriptorProto.name");
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional int32 number = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_number(&has_bits);
          number_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.EnumValueOptions options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_options(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}